

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execShiftIm<(moira::Instr)13,(moira::Mode)11,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 uVar1;
  uint cnt;
  
  cnt = 8;
  if ((opcode & 0xe00) != 0) {
    cnt = opcode >> 9 & 7;
  }
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  (*this->_vptr_Moira[0x19])(this,(ulong)(cnt * 2 + 2));
  uVar1 = shift<(moira::Instr)13,(moira::Size)2>
                    (this,cnt,(ulong)*(ushort *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58)
                    );
  *(short *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = (short)uVar1;
  return;
}

Assistant:

void
Moira::execShiftIm(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);
    int cnt = src ? src : 8;

    prefetch<POLLIPL>();
    sync((S == Long ? 4 : 2) + 2 * cnt);

    writeD<S>(dst, shift<I,S>(cnt, readD<S>(dst)));
}